

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
TryEmplaceHint<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(TryEmplaceHint<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  result_type_conflict1 rVar3;
  ulong uVar4;
  mt19937_64 *__urng;
  long lVar5;
  pointer *__ptr;
  char *pcVar6;
  T val2;
  T val;
  TypeParam m;
  AssertHelper local_548;
  AssertHelper local_540;
  undefined1 local_538 [8];
  _Alloc_hider local_530;
  ulong local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  result_type_conflict1 local_510 [2];
  undefined1 local_508 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_500;
  anon_union_8_1_a8a14541_for_iterator_1 local_4f0;
  undefined **appuStack_4e0 [2];
  pair<const_phmap::priv::NonStandardLayout,_int> local_4d0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_4a0;
  
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_4d0,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)&local_4a0);
  lVar5 = 0x40;
  do {
    *(undefined8 *)((long)&local_4d0.first._vptr_NonStandardLayout + lVar5) = 0;
    *(undefined8 *)((long)local_4a0.sets_._M_elems + lVar5 + -0x28) = 0;
    *(undefined8 *)((long)appuStack_4e0 + lVar5) = 0;
    *(undefined8 *)((long)appuStack_4e0 + lVar5 + 8) = 0;
    *(undefined8 *)((long)local_4a0.sets_._M_elems + lVar5 + -0x18) = 0;
    *(long *)((long)local_4a0.sets_._M_elems + lVar5 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_4a0.sets_._M_elems + lVar5 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_4a0.sets_._M_elems[0].set_.ctrl_ + lVar5) = 0;
    lVar5 = lVar5 + 0x48;
  } while (lVar5 != 0x4c0);
  uVar4 = std::_Hash_bytes(local_4d0.first.value._M_dataplus._M_p,
                           local_4d0.first.value._M_string_length,0xc70f6907);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::try_emplace_impl_with_hash<phmap::priv::NonStandardLayout_const&,int&>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
              *)local_508,
             (parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
              *)&local_4a0,
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),&local_4d0.first,&local_4d0.second);
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::NonStandardLayout_const,int>,std::pair<phmap::priv::NonStandardLayout_const,int>>
            ((internal *)local_508,"val","*it",&local_4d0,
             (pair<const_phmap::priv::NonStandardLayout,_int> *)local_4f0.slot_);
  if (local_508[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_538);
    if (local_500 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_500->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_548,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0xb9,pcVar6);
    testing::internal::AssertHelper::operator=(&local_548,(Message *)local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_548);
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_538 !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_538 + 8))();
    }
  }
  if (local_500 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_500,local_500);
  }
  local_508._0_4_ = 0;
  local_508._4_4_ = 0x7fffffff;
  __urng = hash_internal::GetSharedRng();
  rVar3 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)local_508,__urng,(param_type *)local_508);
  local_538 = (undefined1  [8])&PTR__NonStandardLayout_00344318;
  local_530._M_p = (pointer)&local_520;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_530,local_4d0.first.value._M_dataplus._M_p,
             local_4d0.first.value._M_dataplus._M_p + local_4d0.first.value._M_string_length);
  local_510[0] = rVar3;
  uVar4 = std::_Hash_bytes(local_530._M_p,local_528,0xc70f6907);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4;
  parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::try_emplace_impl_with_hash<phmap::priv::NonStandardLayout_const&,int&>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
              *)local_508,
             (parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
              *)&local_4a0,
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),(NonStandardLayout *)local_538,local_510
            );
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::NonStandardLayout_const,int>,std::pair<phmap::priv::NonStandardLayout_const,int>>
            ((internal *)local_508,"val","*it",&local_4d0,
             (pair<const_phmap::priv::NonStandardLayout,_int> *)local_4f0.slot_);
  if (local_508[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_548);
    if (local_500 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_500->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0xbc,pcVar6);
    testing::internal::AssertHelper::operator=(&local_540,(Message *)&local_548);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    if (local_548.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_548.data_ + 8))();
    }
  }
  if (local_500 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_500,local_500);
  }
  local_538 = (undefined1  [8])&PTR__NonStandardLayout_00344318;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_p != &local_520) {
    operator_delete(local_530._M_p,local_520._M_allocated_capacity + 1);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~parallel_hash_set(&local_4a0);
  local_4d0.first._vptr_NonStandardLayout = (_func_int **)&PTR__NonStandardLayout_00344318;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0.first.value._M_dataplus._M_p != &local_4d0.first.value.field_2) {
    operator_delete(local_4d0.first.value._M_dataplus._M_p,
                    local_4d0.first.value.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, TryEmplaceHint) {
#ifdef UNORDERED_MAP_CXX17
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  // TODO(alkis): We need a way to run emplace in a more meaningful way. Perhaps
  // with test traits/policy.
  auto it = m.try_emplace(m.end(), val.first, val.second);
  EXPECT_EQ(val, *it);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  it = m.try_emplace(it, val2.first, val2.second);
  EXPECT_EQ(val, *it);
#endif
}